

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void __thiscall CVmBigNumCache::~CVmBigNumCache(CVmBigNumCache *this)

{
  char *pcVar1;
  CVmBigNumCacheReg *__ptr;
  size_t sVar2;
  
  __ptr = this->reg_;
  sVar2 = this->max_regs_;
  if (sVar2 != 0) {
    do {
      if (__ptr->buf_ != (char *)0x0) {
        free(__ptr->buf_);
      }
      __ptr = __ptr + 1;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
    __ptr = this->reg_;
  }
  free(__ptr);
  pcVar1 = (this->ln10_).buf_;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  pcVar1 = (this->ln2_).buf_;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  pcVar1 = (this->pi_).buf_;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  pcVar1 = (this->e_).buf_;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  pcVar1 = (this->dbl_max_).buf_;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  pcVar1 = (this->dbl_min_).buf_;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
    return;
  }
  return;
}

Assistant:

CVmBigNumCache::~CVmBigNumCache()
{
    CVmBigNumCacheReg *p;
    size_t i;

    /* delete each of our allocated registers */
    for (p = reg_, i = max_regs_ ; i != 0 ; ++p, --i)
        p->free_mem();

    /* free the register list array */
    t3free(reg_);

    /* free the constant value registers */
    ln10_.free_mem();
    ln2_.free_mem();
    pi_.free_mem();
    e_.free_mem();
    dbl_max_.free_mem();
    dbl_min_.free_mem();
}